

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.hh
# Opt level: O3

void __thiscall tinyusdz::ascii::AsciiParser::PushWarn(AsciiParser *this,string *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_type local_40;
  
  paVar1 = &local_40.err.field_2;
  local_40.err._M_string_length = 0;
  local_40.err.field_2._M_local_buf[0] = '\0';
  local_40.cursor = this->_curr_cursor;
  local_40.err._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_assign((string *)&local_40);
  ::std::
  deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ::push_back(&(this->warn_stack).c,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.err._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.err._M_dataplus._M_p,
                    CONCAT71(local_40.err.field_2._M_allocated_capacity._1_7_,
                             local_40.err.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void PushWarn(const std::string &msg) {
    ErrorDiagnostic diag;
    diag.cursor.row = _curr_cursor.row;
    diag.cursor.col = _curr_cursor.col;
    diag.err = msg;
    warn_stack.push(diag);
  }